

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall fmt::v5::format_int::format_signed(format_int *this,longlong value)

{
  char *pcVar1;
  unsigned_long_long uStack_20;
  bool negative;
  unsigned_long_long abs_value;
  longlong value_local;
  format_int *this_local;
  
  uStack_20 = value;
  if (value < 0) {
    uStack_20 = -value;
  }
  pcVar1 = format_decimal(this,uStack_20);
  this->str_ = pcVar1;
  if (value < 0) {
    pcVar1 = this->str_;
    this->str_ = pcVar1 + -1;
    pcVar1[-1] = '-';
  }
  return;
}

Assistant:

void format_signed(long long value) {
    unsigned long long abs_value = static_cast<unsigned long long>(value);
    bool negative = value < 0;
    if (negative)
      abs_value = 0 - abs_value;
    str_ = format_decimal(abs_value);
    if (negative)
      *--str_ = '-';
  }